

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_backend_sched_split *pgVar1;
  ggml_backend_t backend;
  ggml_tensor *pgVar2;
  ggml_tensor *dst;
  _func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *p_Var3;
  _func_void_ggml_backend_t *p_Var4;
  _Bool _Var5;
  ggml_status gVar6;
  ggml_backend_t pgVar7;
  size_t sVar8;
  ggml_tensor **ppgVar9;
  int i0;
  long lVar10;
  long lVar11;
  int j;
  long lVar12;
  ggml_backend_event_t pgVar13;
  int i1;
  ggml_tensor **local_a8;
  ggml_cgraph local_80;
  
  if ((sched->is_reset == false) && (sched->is_alloc == false)) {
    ggml_backend_sched_reset(sched);
  }
  if ((sched->is_alloc != false) || (_Var5 = ggml_backend_sched_alloc_graph(sched,graph), _Var5)) {
    pgVar1 = sched->splits;
    local_a8 = pgVar1->inputs;
    for (lVar11 = 0; lVar11 < sched->n_splits; lVar11 = lVar11 + 1) {
      lVar10 = (long)pgVar1[lVar11].backend_id;
      backend = sched->backends[lVar10];
      for (lVar12 = 0; lVar12 < pgVar1[lVar11].n_inputs; lVar12 = lVar12 + 1) {
        pgVar7 = ggml_backend_sched_get_tensor_backend(sched,local_a8[lVar12]);
        pgVar2 = local_a8[lVar12];
        ppgVar9 = sched->hv_tensor_copies;
        sVar8 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
        dst = ppgVar9[(long)sched->n_backends * (long)sched->n_copies * sVar8 +
                      sched->n_copies * lVar10 + (long)sched->cur_copy];
        pgVar13 = sched->events[lVar10][sched->cur_copy];
        if ((pgVar2->flags & 1) == 0) {
          if (pgVar13 == (ggml_backend_event_t)0x0) {
            p_Var4 = (backend->iface).synchronize;
            if (p_Var4 != (_func_void_ggml_backend_t *)0x0) {
              (*p_Var4)(backend);
            }
          }
          else {
            ggml_backend_event_wait(backend,pgVar13);
          }
          p_Var3 = (backend->iface).cpy_tensor_async;
          if ((p_Var3 == (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr
                          *)0x0) || (_Var5 = (*p_Var3)(pgVar7,backend,pgVar2,dst), !_Var5)) {
            p_Var4 = (pgVar7->iface).synchronize;
            if (p_Var4 != (_func_void_ggml_backend_t *)0x0) {
              (*p_Var4)(pgVar7);
            }
            pgVar13 = sched->events[lVar10][sched->cur_copy];
            if (pgVar13 == (ggml_backend_event_t)0x0) goto LAB_0012c969;
LAB_0012c962:
            ggml_backend_event_synchronize(pgVar13);
            goto LAB_0012c97c;
          }
        }
        else {
          if (pgVar13 != (ggml_backend_event_t)0x0) goto LAB_0012c962;
LAB_0012c969:
          p_Var4 = (backend->iface).synchronize;
          if (p_Var4 != (_func_void_ggml_backend_t *)0x0) {
            (*p_Var4)(backend);
          }
LAB_0012c97c:
          ggml_backend_tensor_copy(pgVar2,dst);
        }
      }
      if (sched->callback_eval == (ggml_backend_sched_eval_callback)0x0) {
        gVar6 = (*(backend->iface).graph_compute)(backend,&pgVar1[lVar11].graph);
        if (gVar6 != GGML_STATUS_SUCCESS) {
          return gVar6;
        }
      }
      else {
        i0 = 0;
        do {
          if (pgVar1[lVar11].graph.n_nodes <= i0) break;
          ppgVar9 = pgVar1[lVar11].graph.nodes + i0;
          lVar12 = (long)i0;
          i1 = i0;
          while( true ) {
            i1 = i1 + 1;
            pgVar2 = *ppgVar9;
            _Var5 = (*sched->callback_eval)(pgVar2,true,sched->callback_eval_user_data);
            if ((_Var5) || ((long)pgVar1[lVar11].graph.n_nodes + -1 <= lVar12)) break;
            ppgVar9 = pgVar1[lVar11].graph.nodes + lVar12 + 1;
            lVar12 = lVar12 + 1;
          }
          ggml_graph_view(&local_80,&pgVar1[lVar11].graph,i0,i1);
          gVar6 = (*(backend->iface).graph_compute)(backend,&local_80);
          if (gVar6 != GGML_STATUS_SUCCESS) {
            return gVar6;
          }
          p_Var4 = (backend->iface).synchronize;
          if (p_Var4 != (_func_void_ggml_backend_t *)0x0) {
            (*p_Var4)(backend);
          }
          i0 = i1;
        } while ((!_Var5) ||
                (_Var5 = (*sched->callback_eval)(pgVar2,false,sched->callback_eval_user_data), _Var5
                ));
      }
      if ((0 < pgVar1[lVar11].n_inputs) &&
         (pgVar13 = sched->events[lVar10][sched->cur_copy], pgVar13 != (ggml_backend_event_t)0x0)) {
        ggml_backend_event_record(pgVar13,backend);
      }
      local_a8 = local_a8 + 0x17;
    }
    sched->cur_copy = (sched->cur_copy + 1) % sched->n_copies;
    gVar6 = GGML_STATUS_SUCCESS;
  }
  else {
    gVar6 = GGML_STATUS_ALLOC_FAILED;
  }
  return gVar6;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    if (!sched->is_reset && !sched->is_alloc) {
        ggml_backend_sched_reset(sched);
    }

    if (!sched->is_alloc) {
        if (!ggml_backend_sched_alloc_graph(sched, graph)) {
            return GGML_STATUS_ALLOC_FAILED;
        }
    }

    return ggml_backend_sched_compute_splits(sched);
}